

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,unsigned_long,duckdb::UnaryOperatorWrapper,duckdb::BitStringBitCntOperator>
               (string_t *ldata,unsigned_long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  string_t input;
  string_t input_00;
  string_t input_01;
  bool bVar1;
  unsigned_long uVar2;
  undefined8 *puVar3;
  unsigned_long uVar4;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  unsigned_long in_RDX;
  void *in_RSI;
  void *in_RDI;
  byte in_stack_00000008;
  idx_t i;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff58;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff60;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff68;
  ulong idx;
  ValidityMask *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  idx_t in_stack_ffffffffffffff80;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff88;
  unsigned_long uVar5;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  unsigned_long local_58;
  ulong local_50;
  ulong local_48;
  unsigned_long local_40;
  byte local_31;
  TemplatedValidityMask<unsigned_long> *local_20;
  unsigned_long local_18;
  void *local_10;
  void *local_8;
  
  local_31 = in_stack_00000008 & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + in_RDX * 0x10),in_RSI,
             (void *)((long)in_RSI + in_RDX * 8),
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/common/vector_operations/unary_executor.hpp"
             ,0x62);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_20);
  if (bVar1) {
    for (idx = 0; idx < local_18; idx = idx + 1) {
      input_01.value.pointer.ptr = (char *)in_stack_ffffffffffffff80;
      input_01.value._0_8_ = in_stack_ffffffffffffff78;
      uVar2 = UnaryOperatorWrapper::
              Operation<duckdb::BitStringBitCntOperator,duckdb::string_t,unsigned_long>
                        (input_01,in_stack_ffffffffffffff70,idx,
                         *(void **)((long)local_8 + idx * 0x10 + 8));
      *(unsigned_long *)((long)local_10 + idx * 8) = uVar2;
    }
  }
  else {
    if ((local_31 & 1) == 0) {
      TemplatedValidityMask<unsigned_long>::Initialize
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Copy
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    }
    local_40 = 0;
    local_48 = TemplatedValidityMask<unsigned_long>::EntryCount(0xdefbf7);
    for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
      local_58 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_ffffffffffffff68,(idx_t)in_stack_ffffffffffffff60);
      uVar2 = MinValue<unsigned_long>(local_40 + 0x40,local_18);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_58);
      if (bVar1) {
        for (; uVar4 = local_40, local_40 < uVar2; local_40 = local_40 + 1) {
          input.value.pointer.ptr = (char *)in_stack_ffffffffffffff80;
          input.value._0_8_ = in_stack_ffffffffffffff78;
          uVar4 = UnaryOperatorWrapper::
                  Operation<duckdb::BitStringBitCntOperator,duckdb::string_t,unsigned_long>
                            (input,in_stack_ffffffffffffff70,(idx_t)in_stack_ffffffffffffff68,
                             in_stack_ffffffffffffff60);
          *(unsigned_long *)((long)local_10 + local_40 * 8) = uVar4;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_58);
        uVar5 = local_40;
        uVar4 = uVar2;
        if (!bVar1) {
          for (; uVar4 = local_40, local_40 < uVar2; local_40 = local_40 + 1) {
            in_stack_ffffffffffffff80 = local_40 - uVar5;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              (&local_58,(idx_t *)&stack0xffffffffffffff80);
            if (bVar1) {
              puVar3 = (undefined8 *)((long)local_8 + local_40 * 0x10);
              in_stack_ffffffffffffff70 = (ValidityMask *)*puVar3;
              in_stack_ffffffffffffff78 = puVar3[1];
              input_00.value.pointer.ptr = (char *)in_stack_ffffffffffffff80;
              input_00.value._0_8_ = in_stack_ffffffffffffff78;
              uVar4 = UnaryOperatorWrapper::
                      Operation<duckdb::BitStringBitCntOperator,duckdb::string_t,unsigned_long>
                                (input_00,in_stack_ffffffffffffff70,(idx_t)in_stack_ffffffffffffff68
                                 ,in_stack_ffffffffffffff60);
              *(unsigned_long *)((long)local_10 + local_40 * 8) = uVar4;
            }
          }
        }
      }
      local_40 = uVar4;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}